

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O2

void __thiscall MultiAgentDecisionProcessDiscrete::GetTGet(MultiAgentDecisionProcessDiscrete *this)

{
  GetTGet((MultiAgentDecisionProcessDiscrete *)
          (&(this->super_MultiAgentDecisionProcess).field_0x0 +
          *(long *)(*(long *)&this->super_MultiAgentDecisionProcess + -0x128)));
  return;
}

Assistant:

TGet* MultiAgentDecisionProcessDiscrete::GetTGet() const
{ 
    if(_m_sparse)
        return new TGet_TransitionModelMappingSparse(
                ((TransitionModelMappingSparse*)_m_p_tModel)  ); 
    else
        return new TGet_TransitionModelMapping(
                ((TransitionModelMapping*)_m_p_tModel)  );
}